

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

void print_section(ares_dns_record_t *dnsrec,ares_dns_section_t section)

{
  int iVar1;
  long lVar2;
  ares_dns_rr_t *paVar3;
  undefined8 uVar4;
  ares_dns_rr_t *rr;
  size_t i;
  ares_dns_section_t section_local;
  ares_dns_record_t *dnsrec_local;
  
  lVar2 = ares_dns_record_rr_cnt(dnsrec,section);
  if ((lVar2 != 0) &&
     ((lVar2 = ares_dns_record_rr_cnt(dnsrec,section), lVar2 != 1 ||
      (paVar3 = has_opt(dnsrec,section), paVar3 == (ares_dns_rr_t *)0x0)))) {
    if (global_config.opts.display_comments != ARES_FALSE) {
      uVar4 = ares_dns_section_tostr(section);
      printf(";; %s SECTION:\n",uVar4);
    }
    for (rr = (ares_dns_rr_t *)0x0; paVar3 = (ares_dns_rr_t *)ares_dns_record_rr_cnt(dnsrec,section)
        , rr < paVar3; rr = rr + 1) {
      paVar3 = (ares_dns_rr_t *)ares_dns_record_rr_get_const(dnsrec,section,rr);
      iVar1 = ares_dns_rr_get_type(paVar3);
      if (iVar1 != 0x29) {
        print_rr(paVar3);
      }
    }
    if (global_config.opts.display_comments != ARES_FALSE) {
      printf("\n");
    }
  }
  return;
}

Assistant:

static void print_section(const ares_dns_record_t *dnsrec,
                          ares_dns_section_t       section)
{
  size_t i;

  if (ares_dns_record_rr_cnt(dnsrec, section) == 0 ||
      (ares_dns_record_rr_cnt(dnsrec, section) == 1 &&
       has_opt(dnsrec, section) != NULL)) {
    return;
  }

  if (global_config.opts.display_comments) {
    printf(";; %s SECTION:\n", ares_dns_section_tostr(section));
  }
  for (i = 0; i < ares_dns_record_rr_cnt(dnsrec, section); i++) {
    const ares_dns_rr_t *rr = ares_dns_record_rr_get_const(dnsrec, section, i);
    if (ares_dns_rr_get_type(rr) == ARES_REC_TYPE_OPT) {
      continue;
    }
    print_rr(rr);
  }
  if (global_config.opts.display_comments) {
    printf("\n");
  }
}